

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall leveldb::Footer::EncodeTo(Footer *this,string *dst)

{
  ulong in_RSI;
  string *in_RDI;
  size_t original_size;
  undefined4 in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  
  std::__cxx11::string::size();
  BlockHandle::EncodeTo
            ((BlockHandle *)in_RDI,
             (string *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  BlockHandle::EncodeTo
            ((BlockHandle *)in_RDI,
             (string *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  std::__cxx11::string::resize(in_RSI);
  PutFixed32(in_RDI,in_stack_ffffffffffffffdc);
  PutFixed32(in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void Footer::EncodeTo(std::string* dst) const {
  const size_t original_size = dst->size();
  metaindex_handle_.EncodeTo(dst);
  index_handle_.EncodeTo(dst);
  dst->resize(2 * BlockHandle::kMaxEncodedLength);  // Padding
  PutFixed32(dst, static_cast<uint32_t>(kTableMagicNumber & 0xffffffffu));
  PutFixed32(dst, static_cast<uint32_t>(kTableMagicNumber >> 32));
  assert(dst->size() == original_size + kEncodedLength);
  (void)original_size;  // Disable unused variable warning.
}